

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FieldDescriptorProto::Clear(FieldDescriptorProto *this)

{
  uint uVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_169;
  LogMessage local_168;
  LogMessage local_130;
  LogMessage local_f8;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      if ((this->name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x114e);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
        internal::LogMessage::~LogMessage(&local_50);
      }
      psVar2 = (this->name_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      if ((this->extendee_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1152);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !extendee_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
        internal::LogMessage::~LogMessage(&local_88);
      }
      psVar2 = (this->extendee_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 4) != 0) {
      if ((this->type_name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1156);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_c0,
                            "CHECK failed: !type_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_f8,pLVar3);
        internal::LogMessage::~LogMessage(&local_c0);
      }
      psVar2 = (this->type_name_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 8) != 0) {
      if ((this->default_value_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
      {
        internal::LogMessage::LogMessage
                  (&local_f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x115a);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_f8,
                            "CHECK failed: !default_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_130,pLVar3);
        internal::LogMessage::~LogMessage(&local_f8);
      }
      psVar2 = (this->default_value_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 0x10) != 0) {
      if ((this->json_name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::LogMessage::LogMessage
                  (&local_130,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x115e);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_130,
                            "CHECK failed: !json_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_168,pLVar3);
        internal::LogMessage::~LogMessage(&local_130);
      }
      psVar2 = (this->json_name_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 0x20) != 0) {
      if (this->options_ == (FieldOptions *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_168,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1162);
        pLVar3 = internal::LogMessage::operator<<(&local_168,"CHECK failed: options_ != NULL: ");
        internal::LogFinisher::operator=(&local_169,pLVar3);
        internal::LogMessage::~LogMessage(&local_168);
      }
      FieldOptions::Clear(this->options_);
    }
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xc0) != 0) {
    this->number_ = 0;
    this->oneof_index_ = 0;
  }
  if ((uVar1 & 0x300) != 0) {
    this->label_ = 1;
    this->type_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void FieldDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldDescriptorProto)
  if (_has_bits_[0 / 32] & 63u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_extendee()) {
      GOOGLE_DCHECK(!extendee_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*extendee_.UnsafeRawStringPointer())->clear();
    }
    if (has_type_name()) {
      GOOGLE_DCHECK(!type_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*type_name_.UnsafeRawStringPointer())->clear();
    }
    if (has_default_value()) {
      GOOGLE_DCHECK(!default_value_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*default_value_.UnsafeRawStringPointer())->clear();
    }
    if (has_json_name()) {
      GOOGLE_DCHECK(!json_name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*json_name_.UnsafeRawStringPointer())->clear();
    }
    if (has_options()) {
      GOOGLE_DCHECK(options_ != NULL);
      options_->::google::protobuf::FieldOptions::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 192u) {
    ::memset(&number_, 0, reinterpret_cast<char*>(&oneof_index_) -
      reinterpret_cast<char*>(&number_) + sizeof(oneof_index_));
  }
  if (_has_bits_[8 / 32] & 768u) {
    label_ = 1;
    type_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}